

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_api.h
# Opt level: O2

bool __thiscall benchmark::State::KeepRunning(State *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->started_ == false) {
    if (this->finished_ == true) {
      __assert_fail("!finished_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/include/benchmark/benchmark_api.h"
                    ,0x119,"bool benchmark::State::KeepRunning()");
    }
    this->started_ = true;
    ResumeTiming(this);
  }
  uVar1 = this->total_iterations_;
  uVar2 = this->max_iterations;
  this->total_iterations_ = uVar1 + 1;
  if (uVar2 <= uVar1) {
    if ((this->started_ != true) ||
       ((this->finished_ == true && ((this->error_occurred_ & 1U) == 0)))) {
      __assert_fail("started_ && (!finished_ || error_occurred_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/include/benchmark/benchmark_api.h"
                    ,0x11f,"bool benchmark::State::KeepRunning()");
    }
    uVar3 = uVar2;
    if ((this->error_occurred_ & 1U) == 0) {
      PauseTiming(this);
      uVar3 = this->max_iterations;
    }
    this->total_iterations_ = uVar3;
    this->finished_ = true;
  }
  return uVar1 < uVar2;
}

Assistant:

bool KeepRunning() {
    if (BENCHMARK_BUILTIN_EXPECT(!started_, false)) {
      assert(!finished_);
      started_ = true;
      ResumeTiming();
    }
    bool const res = total_iterations_++ < max_iterations;
    if (BENCHMARK_BUILTIN_EXPECT(!res, false)) {
      assert(started_ && (!finished_ || error_occurred_));
      if (!error_occurred_) {
        PauseTiming();
      }
      // Total iterations now is one greater than max iterations. Fix this.
      total_iterations_ = max_iterations;
      finished_ = true;
    }
    return res;
  }